

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::Filesystem,_std::nullptr_t> kj::newDiskFilesystem(void)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  Filesystem *extraout_RDX;
  Filesystem *extraout_RDX_00;
  Filesystem *extraout_RDX_01;
  Filesystem *extraout_RDX_02;
  Filesystem *pFVar8;
  char *pcVar9;
  ulong count;
  Disposer *in_RDI;
  Own<kj::Filesystem,_std::nullptr_t> OVar10;
  StringPtr path_00;
  StringPtr path_01;
  DebugComparison<const_char_&,_char> _kjCondition;
  char *pwd;
  Path result;
  Fault f;
  stat pwdStat;
  stat dotStat;
  StringPtr path;
  Array<char> buf_heap;
  char buf_stack [256];
  
  pp_Var4 = (_func_int **)operator_new(0x40);
  *pp_Var4 = (_func_int *)&PTR_getRoot_00260c90;
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)buf_stack,"/");
  uVar1 = buf_stack._0_4_;
  buf_stack[0] = -1;
  buf_stack[1] = -1;
  buf_stack[2] = -1;
  buf_stack[3] = -1;
  *(undefined4 *)(pp_Var4 + 2) = uVar1;
  pp_Var4[1] = (_func_int *)&PTR_getFd_00260808;
  OwnFd::~OwnFd((OwnFd *)buf_stack);
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)buf_stack,".");
  *(undefined4 *)(pp_Var4 + 4) = buf_stack._0_4_;
  buf_stack[0] = -1;
  buf_stack[1] = -1;
  buf_stack[2] = -1;
  buf_stack[3] = -1;
  pp_Var4[3] = (_func_int *)&PTR_getFd_00260808;
  OwnFd::~OwnFd((OwnFd *)buf_stack);
  pwd = getenv("PWD");
  if (pwd != (char *)0x0) {
    result.parts.disposer = (ArrayDisposer *)0x0;
    result.parts.ptr = (String *)0x0;
    result.parts.size_ = 0;
    _kjCondition.result = *pwd == '/';
    _kjCondition.right = '/';
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.left = pwd;
    if (_kjCondition.result) {
      pcVar9 = pwd + 1;
      sVar5 = strlen(pcVar9);
      path_00.content.size_ = sVar5 + 1;
      path_00.content.ptr = pcVar9;
      Path::parse((Path *)&_kjCondition,path_00);
      Array<kj::String>::operator=(&result.parts,(Array<kj::String> *)&_kjCondition);
      Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
      do {
        Path::toString((String *)&_kjCondition,&result,true);
        pcVar9 = "";
        if (CONCAT71(_kjCondition._9_7_,_kjCondition.right) != 0) {
          pcVar9 = _kjCondition.left;
        }
        iVar3 = lstat64(pcVar9,(stat64 *)&pwdStat);
        Array<char>::~Array((Array<char> *)&_kjCondition);
        if (-1 < iVar3) goto LAB_001ddac1;
        iVar3 = _::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 == 0) {
LAB_001ddac1:
        do {
          iVar3 = lstat64(".",(stat64 *)&dotStat);
          if (-1 < iVar3) goto LAB_001ddb98;
          iVar3 = _::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        if (iVar3 != 0) {
          _::Debug::Fault::Fault
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x6a1,iVar3,"lstat(\".\", &dotStat)","");
          _::Debug::Fault::~Fault((Fault *)&_kjCondition);
        }
      }
      else {
        _::Debug::Fault::Fault<int,kj::Path&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a0,iVar3,"lstat(result.toString(true).cStr(), &pwdStat)","result",&result);
        _::Debug::Fault::~Fault((Fault *)&_kjCondition);
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x69e,FAILED,"pwd[0] == \'/\'","_kjCondition,",&_kjCondition);
      _::Debug::Fault::~Fault(&f);
    }
LAB_001ddb98:
    buf_heap.ptr = (char *)((ulong)buf_heap.ptr & 0xffffffffffffff00);
    _::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)buf_stack,(NullableValue<kj::Exception> *)&buf_heap);
    _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&buf_heap);
    if (buf_stack[0] == '\x01') {
      if (_::Debug::minSeverity < 2) {
        _::Debug::log<char_const(&)[39],char_const*&,kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a4,WARNING,"\"PWD environment variable seems invalid\", pwd, e",
                   (char (*) [39])"PWD environment variable seems invalid",&pwd,
                   (Exception *)(buf_stack + 8));
      }
    }
    else {
      if ((pwdStat.st_ino == dotStat.st_ino) &&
         (pwdStat.st_dev == CONCAT71(dotStat.st_dev._1_7_,(undefined1)dotStat.st_dev))) {
        pp_Var4[5] = (_func_int *)result.parts.ptr;
        pp_Var4[6] = (_func_int *)result.parts.size_;
        pp_Var4[7] = (_func_int *)result.parts.disposer;
        result.parts.ptr = (String *)0x0;
        result.parts.size_ = 0;
        _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)buf_stack);
        Array<kj::String>::~Array(&result.parts);
        goto LAB_001dde17;
      }
      if (_::Debug::minSeverity < 1) {
        _::Debug::log<char_const(&)[57],char_const*&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6b1,INFO,"\"PWD environment variable doesn\'t match current directory\", pwd",
                   (char (*) [57])"PWD environment variable doesn\'t match current directory",&pwd);
      }
    }
    _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)buf_stack);
    Array<kj::String>::~Array(&result.parts);
  }
  count = 0x100;
  do {
    if (count < 0x101) {
      buf_heap.ptr = (char *)0x0;
      buf_heap.size_ = 0;
      buf_heap.disposer = (ArrayDisposer *)0x0;
      pcVar9 = buf_stack;
    }
    else {
      pcVar9 = _::HeapArrayDisposer::allocate<char>(count);
      buf_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      buf_heap.ptr = pcVar9;
      buf_heap.size_ = count;
    }
    pcVar6 = getcwd(pcVar9,count);
    if (pcVar6 == (char *)0x0) {
      piVar7 = __errno_location();
      if (*piVar7 != 0x22) {
        _::Debug::Fault::Fault
                  ((Fault *)&path,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6bf,*piVar7,"getcwd()","");
        _::Debug::Fault::fatal((Fault *)&path);
      }
      count = count * 2;
    }
    else {
      sVar5 = strlen(pcVar9);
      path.content.size_ = sVar5 + 1;
      pwdStat.st_dev = (__dev_t)anon_var_dwarf_35b801;
      pwdStat.st_ino = 0xe;
      path.content.ptr = pcVar9;
      bVar2 = StringPtr::startsWith(&path,(StringPtr *)&pwdStat);
      dotStat.st_dev._0_1_ = !bVar2;
      if (bVar2) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45],kj::StringPtr&>
                  ((Fault *)&pwdStat,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c8,FAILED,"!path.startsWith(\"(unreachable)\")",
                   "_kjCondition,\"working directory is not reachable from root\", path",
                   (DebugExpression<bool> *)&dotStat,
                   (char (*) [45])"working directory is not reachable from root",&path);
        _::Debug::Fault::fatal((Fault *)&pwdStat);
      }
      pwdStat.st_dev =
           (long)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" + 0x3f;
      pwdStat.st_ino = 2;
      dotStat.st_dev._0_1_ = StringPtr::startsWith(&path,(StringPtr *)&pwdStat);
      if (!(bool)(undefined1)dotStat.st_dev) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34],kj::StringPtr&>
                  ((Fault *)&pwdStat,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c9,FAILED,"path.startsWith(\"/\")",
                   "_kjCondition,\"current directory is not absolute\", path",
                   (DebugExpression<bool> *)&dotStat,
                   (char (*) [34])"current directory is not absolute",&path);
        _::Debug::Fault::fatal((Fault *)&pwdStat);
      }
      path_01.content.ptr = path.content.ptr + 1;
      path_01.content.size_ = path.content.size_ - 1;
      Path::parse((Path *)(pp_Var4 + 5),path_01);
    }
    Array<char>::~Array(&buf_heap);
  } while (pcVar6 == (char *)0x0);
LAB_001dde17:
  do {
    iVar3 = stat64("/dev/..",(stat64 *)buf_stack);
    if (-1 < iVar3) goto LAB_001dde49;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  pFVar8 = extraout_RDX;
  if (iVar3 == 0) {
LAB_001dde49:
    do {
      iVar3 = fstat64(((OwnFd *)(pp_Var4 + 2))->fd,(stat64 *)&buf_heap);
      pFVar8 = extraout_RDX_00;
      if (-1 < iVar3) goto LAB_001dde75;
      iVar3 = _::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    pFVar8 = extraout_RDX_01;
    if (iVar3 != 0) {
      _::Debug::Fault::Fault
                ((Fault *)&path,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x675,iVar3,"fstat(root.DiskHandle::getFd(), &fsRoot)","");
      _::Debug::Fault::fatal((Fault *)&path);
    }
LAB_001dde75:
    if (buf_stack._8_8_ != buf_heap.size_) {
      if (_::Debug::minSeverity < 2) {
        _::Debug::log<char_const(&)[75]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x677,WARNING,
                   "\"root dir file descriptor is broken, probably because of qemu; compensating\"",
                   (char (*) [75])
                   "root dir file descriptor is broken, probably because of qemu; compensating");
      }
      anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)&path,"/dev/..");
      OwnFd::operator=((OwnFd *)(pp_Var4 + 2),(OwnFd *)&path);
      OwnFd::~OwnFd((OwnFd *)&path);
      pFVar8 = extraout_RDX_02;
    }
  }
  in_RDI->_vptr_Disposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem>::instance;
  in_RDI[1]._vptr_Disposer = pp_Var4;
  OVar10.ptr = pFVar8;
  OVar10.disposer = in_RDI;
  return OVar10;
}

Assistant:

Own<Filesystem> newDiskFilesystem() {
  return heap<DiskFilesystem>();
}